

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void rgba_8888_to_single_channel_8
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  if (0 < height) {
    puVar2 = (undefined1 *)((long)dst + (long)(dy * dst_pitch) + (long)dx);
    lVar3 = (long)src + (long)sx * 4 + (long)(sy * src_pitch);
    iVar4 = src_pitch + 3;
    if (-1 < src_pitch) {
      iVar4 = src_pitch;
    }
    iVar5 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar2 + width;
        do {
          *puVar2 = *(undefined1 *)(lVar3 + 3);
          puVar2 = puVar2 + 1;
          lVar3 = lVar3 + 4;
        } while (puVar2 < puVar1);
      }
      puVar2 = puVar2 + (dst_pitch - width);
      lVar3 = lVar3 + (long)((iVar4 >> 2) - width) * 4;
      iVar5 = iVar5 + 1;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

static void rgba_8888_to_single_channel_8(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   uint8_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 1 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint8_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBA_8888_TO_SINGLE_CHANNEL_8(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}